

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  uint uVar6;
  ImGuiWindow *pIVar7;
  ImGuiGroupData *pIVar8;
  ImRect IVar9;
  ulong uVar10;
  undefined8 uVar11;
  ImGuiContext *pIVar12;
  char cVar13;
  ImGuiID IVar14;
  long lVar15;
  bool bVar16;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int in_XMM2_Da;
  int in_XMM2_Db;
  int in_XMM2_Dc;
  int in_XMM2_Dd;
  ImRect group_bb;
  ImRect local_38;
  ImVec2 local_28;
  undefined1 auVar17 [16];
  
  pIVar12 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  pIVar8 = (GImGui->GroupStack).Data;
  lVar15 = (long)(GImGui->GroupStack).Size;
  IVar4 = (pIVar7->DC).CursorMaxPos;
  auVar19._8_8_ = 0;
  auVar19._0_4_ = IVar4.x;
  auVar19._4_4_ = IVar4.y;
  IVar5 = pIVar8[lVar15 + -1].BackupCursorPos;
  auVar21._8_8_ = 0;
  auVar21._0_4_ = IVar5.x;
  auVar21._4_4_ = IVar5.y;
  uVar10 = vcmpps_avx512vl(auVar21,auVar19,2);
  auVar17 = vblendmps_avx512vl(auVar21,auVar19);
  bVar16 = (bool)((byte)uVar10 & 1);
  auVar18._0_4_ = (uint)bVar16 * auVar17._0_4_ | (uint)!bVar16 * in_XMM2_Da;
  bVar16 = (bool)((byte)(uVar10 >> 1) & 1);
  auVar18._4_4_ = (uint)bVar16 * auVar17._4_4_ | (uint)!bVar16 * in_XMM2_Db;
  bVar16 = (bool)((byte)(uVar10 >> 2) & 1);
  auVar18._8_4_ = (uint)bVar16 * auVar17._8_4_ | (uint)!bVar16 * in_XMM2_Dc;
  bVar16 = (bool)((byte)(uVar10 >> 3) & 1);
  auVar18._12_4_ = (uint)bVar16 * auVar17._12_4_ | (uint)!bVar16 * in_XMM2_Dd;
  IVar9 = (ImRect)vmovlhps_avx(auVar21,auVar18);
  (pIVar7->DC).CursorPos = IVar5;
  IVar5 = pIVar8[lVar15 + -1].BackupCursorMaxPos;
  auVar22._8_8_ = 0;
  auVar22._0_4_ = IVar5.x;
  auVar22._4_4_ = IVar5.y;
  uVar10 = vcmpps_avx512vl(auVar19,auVar22,2);
  bVar16 = (bool)((byte)uVar10 & 1);
  auVar17._0_4_ = (uint)bVar16 * (int)IVar5.x | (uint)!bVar16 * (int)IVar4.x;
  bVar16 = (bool)((byte)(uVar10 >> 1) & 1);
  auVar17._4_4_ = (uint)bVar16 * (int)IVar5.y | (uint)!bVar16 * (int)IVar4.y;
  auVar17._8_8_ = 0;
  IVar4 = (ImVec2)vmovlps_avx(auVar17);
  (pIVar7->DC).CursorMaxPos = IVar4;
  (pIVar7->DC).Indent.x = pIVar8[lVar15 + -1].BackupIndent.x;
  (pIVar7->DC).GroupOffset.x = pIVar8[lVar15 + -1].BackupGroupOffset.x;
  (pIVar7->DC).CurrLineSize = pIVar8[lVar15 + -1].BackupCurrLineSize;
  fVar2 = pIVar8[lVar15 + -1].BackupCurrLineTextBaseOffset;
  (pIVar7->DC).CurrLineTextBaseOffset = fVar2;
  if (pIVar12->LogEnabled == true) {
    pIVar12->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar8[lVar15 + -1].EmitItem != true) goto LAB_002c3cf4;
  fVar3 = (pIVar7->DC).PrevLineTextBaseOffset;
  uVar11 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar3),2);
  bVar16 = (bool)((byte)uVar11 & 1);
  (pIVar7->DC).CurrLineTextBaseOffset =
       (float)((uint)bVar16 * (int)fVar3 + (uint)!bVar16 * (int)fVar2);
  local_38.Min = IVar9.Min;
  auVar20._8_8_ = 0;
  auVar20._0_4_ = local_38.Min.x;
  auVar20._4_4_ = local_38.Min.y;
  local_38.Max = IVar9.Max;
  auVar23._8_8_ = 0;
  auVar23._0_4_ = local_38.Max.x;
  auVar23._4_4_ = local_38.Max.y;
  auVar17 = vsubps_avx(auVar23,auVar20);
  local_28 = (ImVec2)vmovlps_avx(auVar17);
  local_38 = IVar9;
  ItemSize(&local_28,-1.0);
  bVar16 = false;
  ItemAdd(&local_38,0,(ImRect *)0x0,1);
  IVar14 = pIVar12->ActiveId;
  if (pIVar8[lVar15 + -1].BackupActiveIdIsAlive != IVar14) {
    bVar16 = IVar14 != 0 && pIVar12->ActiveIdIsAlive == IVar14;
  }
  if (pIVar8[lVar15 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
    cVar13 = pIVar12->ActiveIdPreviousFrameIsAlive;
  }
  else {
    cVar13 = '\0';
  }
  if (bVar16) {
LAB_002c3c7e:
    (pIVar12->LastItemData).ID = IVar14;
  }
  else if (cVar13 != '\0') {
    IVar14 = pIVar12->ActiveIdPreviousFrame;
    goto LAB_002c3c7e;
  }
  (pIVar12->LastItemData).Rect.Min = local_38.Min;
  (pIVar12->LastItemData).Rect.Max = local_38.Max;
  if ((pIVar8[lVar15 + -1].BackupHoveredIdIsAlive == false) && (pIVar12->HoveredId != 0)) {
    pIVar1 = &(pIVar12->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar16) && (pIVar12->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar12->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar6 = (pIVar12->LastItemData).StatusFlags;
  (pIVar12->LastItemData).StatusFlags = uVar6 | 0x20;
  if ((cVar13 != '\0') && (pIVar12->ActiveId != pIVar12->ActiveIdPreviousFrame)) {
    (pIVar12->LastItemData).StatusFlags = uVar6 | 0x60;
  }
LAB_002c3cf4:
  (pIVar12->GroupStack).Size = (pIVar12->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}